

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_sauf_4c.h
# Opt level: O3

void __thiscall SAUF4C<UFPC>::PerformLabeling(SAUF4C<UFPC> *this)

{
  uint uVar1;
  int iVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  long lVar5;
  uint uVar6;
  uint *puVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  long local_d0;
  Mat local_b8 [96];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)4,_false>).img_;
  uVar8 = *(uint *)&pMVar3->field_0x8;
  uVar1 = *(uint *)&pMVar3->field_0xc;
  cv::Mat::Mat(local_b8,**(int **)&pMVar3->field_0x40,(*(int **)&pMVar3->field_0x40)[1],4);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  cv::Mat::operator=(local_b8,(Scalar_ *)&local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)4,_false>).img_labels_)->super_Mat,
                     local_b8);
  cv::Mat::~Mat(local_b8);
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)4,_false>).img_;
  puVar7 = (uint *)operator_new__((long)*(int *)&pMVar3->field_0xc *
                                  (long)*(int *)&pMVar3->field_0x8 * 2 + 6U & 0x3fffffffc);
  UFPC::P_ = puVar7;
  *puVar7 = 0;
  UFPC::length_ = 1;
  uVar6 = 1;
  if (0 < (int)uVar8) {
    local_d0 = -1;
    uVar16 = 0;
    do {
      if (0 < (int)uVar1) {
        pMVar3 = (this->super_Labeling2D<(Connectivity2D)4,_false>).img_;
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)4,_false>).img_labels_;
        lVar5 = *(long *)&pMVar3->field_0x10;
        lVar13 = **(long **)&pMVar3->field_0x48;
        lVar12 = *(long *)&pMVar4->field_0x10;
        lVar10 = **(long **)&pMVar4->field_0x48;
        lVar9 = lVar12 + lVar10 * uVar16;
        lVar15 = lVar9 + -4;
        lVar12 = lVar10 * local_d0 + lVar12;
        lVar10 = lVar13 * uVar16 + lVar5;
        uVar11 = 0;
        do {
          if (*(char *)(lVar10 + uVar11) != '\0') {
            if ((uVar16 == 0) || (*(char *)(lVar13 * local_d0 + lVar5 + uVar11) == '\0')) {
              if ((uVar11 == 0) || (*(char *)(lVar10 + -1 + uVar11) == '\0')) {
                UFPC::P_[UFPC::length_] = UFPC::length_;
                uVar6 = UFPC::length_;
                UFPC::length_ = UFPC::length_ + 1;
              }
              else {
                uVar6 = *(uint *)(lVar15 + uVar11 * 4);
              }
            }
            else if ((uVar11 == 0) || (*(char *)(lVar10 + -1 + uVar11) == '\0')) {
              uVar6 = *(uint *)(lVar12 + uVar11 * 4);
            }
            else {
              uVar6 = UFPC::Merge(*(uint *)(lVar12 + uVar11 * 4),*(uint *)(lVar15 + uVar11 * 4));
            }
            *(uint *)(lVar9 + uVar11 * 4) = uVar6;
          }
          uVar11 = uVar11 + 1;
        } while (uVar1 != uVar11);
      }
      puVar7 = UFPC::P_;
      uVar16 = uVar16 + 1;
      local_d0 = local_d0 + 1;
    } while (uVar16 != uVar8);
    if (UFPC::length_ < 2) {
      uVar6 = 1;
    }
    else {
      uVar6 = 1;
      uVar16 = 1;
      do {
        if (puVar7[uVar16] < uVar16) {
          uVar8 = puVar7[puVar7[uVar16]];
        }
        else {
          uVar8 = uVar6;
          uVar6 = uVar6 + 1;
        }
        puVar7[uVar16] = uVar8;
        uVar16 = uVar16 + 1;
      } while (uVar16 < UFPC::length_);
    }
  }
  (this->super_Labeling2D<(Connectivity2D)4,_false>).n_labels_ = uVar6;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)4,_false>).img_labels_;
  iVar14 = *(int *)&pMVar4->field_0x8;
  if (0 < iVar14) {
    lVar9 = *(long *)&pMVar4->field_0x10;
    lVar5 = **(long **)&pMVar4->field_0x48;
    lVar13 = 0;
    do {
      iVar2 = *(int *)&pMVar4->field_0xc;
      if ((long)iVar2 != 0) {
        lVar12 = 0;
        do {
          *(uint *)(lVar9 + lVar12) = puVar7[*(uint *)(lVar9 + lVar12)];
          lVar12 = lVar12 + 4;
        } while ((long)iVar2 * 4 != lVar12);
        iVar14 = *(int *)&pMVar4->field_0x8;
      }
      lVar13 = lVar13 + 1;
      lVar9 = lVar9 + lVar5;
    } while (lVar13 < iVar14);
  }
  if (puVar7 != (uint *)0x0) {
    operator_delete__(puVar7);
  }
  return;
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        img_labels_ = cv::Mat1i(img_.size(), 0); // Allocation + initialization of the output image

        LabelsSolver::Alloc(UPPER_BOUND_4_CONNECTIVITY); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First scan
        for (int r = 0; r < h; ++r) {
            // Get row pointers
            unsigned char const * const img_row = img_.ptr<unsigned char>(r);
            unsigned char const * const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned * const  img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned * const  img_labels_row_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; ++c) {
#define CONDITION_Q r > 0 && img_row_prev[c] > 0
#define CONDITION_S c > 0 && img_row[c - 1] > 0
#define CONDITION_X img_row[c] > 0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_4 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_5 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c], img_labels_row[c - 1]); // x <- p + s

#include "labeling_sauf_4c_tree.inc.h"
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        for (int r = 0; r < img_labels_.rows; ++r) {
            unsigned * img_row_start = img_labels_.ptr<unsigned>(r);
            unsigned * const img_row_end = img_row_start + img_labels_.cols;
            for (; img_row_start != img_row_end; ++img_row_start) {
                *img_row_start = LabelsSolver::GetLabel(*img_row_start);
            }
        }

        LabelsSolver::Dealloc(); // Memory deallocation of the labels solver

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_X
    }